

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::stringifyBinaryExpr<long_double,long_double>
          (String *__return_storage_ptr__,detail *this,longdouble *lhs,char *op,longdouble *rhs)

{
  String local_78;
  String local_60;
  String local_48;
  String local_30;
  
  doctest::toString(&local_48,*(longdouble *)this);
  String::String(&local_60,(char *)lhs);
  String::operator+(&local_30,&local_48,&local_60);
  doctest::toString(&local_78,*(longdouble *)op);
  String::operator+(__return_storage_ptr__,&local_30,&local_78);
  String::~String(&local_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }